

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeadReckoningParameter.cpp
# Opt level: O2

void __thiscall
KDIS::DATA_TYPE::DeadReckoningParameter::Decode(DeadReckoningParameter *this,KDataStream *stream)

{
  KUINT16 KVar1;
  KException *this_00;
  KUINT16 i;
  long lVar2;
  allocator<char> local_49;
  KString local_48;
  
  KVar1 = KDataStream::GetBufferSize(stream);
  if (0x27 < KVar1) {
    KDataStream::Read(stream,&this->m_ui8DeadRecknoningAlgorithm);
    for (lVar2 = 0; lVar2 != 0xf; lVar2 = lVar2 + 1) {
      KDataStream::Read(stream,this->m_OtherParams + lVar2);
    }
    (*(this->m_LinearAcceleration).super_DataTypeBase._vptr_DataTypeBase[3])
              (&this->m_LinearAcceleration,stream);
    (*(this->m_AngularVelocity).super_DataTypeBase._vptr_DataTypeBase[3])
              (&this->m_AngularVelocity,stream);
    return;
  }
  this_00 = (KException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"Decode",&local_49);
  KException::KException(this_00,&local_48,2);
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

void DeadReckoningParameter::Decode(KDataStream &stream) noexcept(false)
{
    if( stream.GetBufferSize() < DEAD_RECKONING_PARAMETER_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    stream >> m_ui8DeadRecknoningAlgorithm;

    for( KUINT16 i = 0; i < 15; ++i )
    {
        stream >> m_OtherParams[i];
    }

    stream >> KDIS_STREAM m_LinearAcceleration
           >> KDIS_STREAM m_AngularVelocity;
}